

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-quants.c
# Opt level: O2

int iq1_find_best_neighbour2
              (uint16_t *neighbours,uint64_t *grid,float *xval,float *weight,float scale,float *xg,
              int8_t *L,int ngrid)

{
  ushort uVar1;
  ulong uVar2;
  ulong uVar3;
  char *pcVar4;
  int line;
  long lVar5;
  long lVar6;
  uint64_t *puVar7;
  int j;
  int i;
  long lVar8;
  float fVar9;
  float fVar10;
  float d2;
  float fVar11;
  
  uVar1 = *neighbours;
  if (uVar1 == 0) {
    pcVar4 = "num_neighbors > 0";
    line = 0xfd6;
LAB_0013e053:
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]whisper/ggml/src/ggml-quants.c"
               ,line,"GGML_ASSERT(%s) failed",pcVar4);
  }
  lVar6 = (ulong)uVar1 + 1;
  uVar3 = 0xffffffffffffffff;
  fVar9 = 3.4028235e+38;
  for (lVar5 = 1; lVar5 != lVar6; lVar5 = lVar5 + 1) {
    fVar10 = 0.0;
    for (lVar8 = 0; lVar8 != 8; lVar8 = lVar8 + 1) {
      fVar11 = xg[(short)(*(char *)((long)grid + lVar8 + (ulong)neighbours[lVar5] * 8) + -1) / 2] *
               scale - xval[lVar8];
      fVar10 = fVar10 + weight[lVar8] * fVar11 * fVar11;
    }
    uVar2 = uVar3 & 0xffffffff;
    uVar3 = (ulong)neighbours[lVar5];
    if (fVar9 <= fVar10) {
      fVar10 = fVar9;
      uVar3 = uVar2;
    }
    fVar9 = fVar10;
  }
  if ((int)uVar3 < 0) {
    uVar3 = 0xffffffffffffffff;
    puVar7 = grid;
    for (uVar2 = 0; uVar2 != 0x800; uVar2 = uVar2 + 1) {
      fVar10 = 0.0;
      for (lVar5 = 0; lVar5 != 8; lVar5 = lVar5 + 1) {
        fVar11 = xg[(short)(*(char *)((long)puVar7 + lVar5) + -1) / 2] * scale + -xval[uVar2];
        fVar10 = fVar10 + weight[lVar5] * fVar11 * fVar11;
      }
      if (fVar10 < fVar9) {
        uVar3 = uVar2;
      }
      uVar3 = uVar3 & 0xffffffff;
      if (fVar9 <= fVar10) {
        fVar10 = fVar9;
      }
      puVar7 = puVar7 + 1;
      fVar9 = fVar10;
    }
    if ((int)uVar3 < 0) {
      puts("Oops, did not find grid point");
      printf("Have %d neighbours\n",(ulong)uVar1);
      for (lVar5 = 1; lVar5 != lVar6; lVar5 = lVar5 + 1) {
        fVar9 = 0.0;
        for (lVar8 = 0; lVar8 != 8; lVar8 = lVar8 + 1) {
          fVar9 = fVar9 + xval[lVar8] *
                          weight[lVar8] *
                          xg[(short)(*(char *)((long)grid + lVar8 + (ulong)neighbours[lVar5] * 8) +
                                    -1) / 2];
        }
        printf("    neighbour %d: sumqx = %g sumq2 = %g\n",(double)fVar9);
      }
      pcVar4 = "grid_index >= 0";
      line = 0x1006;
      goto LAB_0013e053;
    }
  }
  for (lVar6 = 0; lVar6 != 8; lVar6 = lVar6 + 1) {
    L[lVar6] = (int8_t)((int)(short)(*(char *)((long)grid + lVar6 + (uVar3 & 0xffffffff) * 8) + -1)
                       / 2);
  }
  return (int)uVar3;
}

Assistant:

static int iq1_find_best_neighbour2(const uint16_t * GGML_RESTRICT neighbours, const uint64_t * GGML_RESTRICT grid,
        const float * GGML_RESTRICT xval, const float * GGML_RESTRICT weight, float scale, const float * GGML_RESTRICT xg, int8_t * GGML_RESTRICT L, int ngrid) {
    int num_neighbors = neighbours[0];
    GGML_ASSERT(num_neighbors > 0);
    float best_score = FLT_MAX;
    int grid_index = -1;
    for (int j = 1; j <= num_neighbors; ++j) {
        const int8_t * pg = (const int8_t *)(grid + neighbours[j]);
        float d2 = 0;
        for (int i = 0; i < 8; ++i) {
            float q = xg[(pg[i] - 1)/2];
            float w = weight[i];
            float diff = scale*q - xval[i];
            d2 += w*diff*diff;
        }
        if (d2 < best_score) {
            best_score = d2;
            grid_index = neighbours[j];
        }
    }
    if (grid_index < 0) {
        for (int i = 0; i < ngrid; ++i) {
            const int8_t * grid_i = (const int8_t *)(grid + i);
            float d2 = 0;
            for (int j = 0; j < 8; ++j) {
                float w = weight[j];
                float q = xg[(grid_i[j] - 1)/2];
                float diff = scale*q - xval[i];
                d2 += w*diff*diff;
            }
            if (d2 < best_score) {
                best_score = d2;
                grid_index = i;
            }
        }
    }
    if (grid_index < 0) {
        printf("Oops, did not find grid point\n");
        printf("Have %d neighbours\n", num_neighbors);
        for (int j = 1; j <= num_neighbors; ++j) {
            const int8_t * pg = (const int8_t *)(grid + neighbours[j]);
            float sumqx = 0, sumq2 = 0;
            for (int i = 0; i < 8; ++i) {
                float q = xg[(pg[i] - 1)/2];
                float w = weight[i];
                sumqx += w*q*xval[i];
                sumq2 += w*q*q;
            }
            printf("    neighbour %d: sumqx = %g sumq2 = %g\n", j, (double)sumqx, (double)sumq2);
        }
    }
    GGML_ASSERT(grid_index >= 0);
    const int8_t * pg = (const int8_t *)(grid + grid_index);
    for (int i = 0; i < 8; ++i) L[i] = (pg[i] - 1)/2;
    return grid_index;
}